

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O1

void performance_tests(int loop_count)

{
  ostream *poVar1;
  rect_size size2;
  rect_size size2_00;
  rect_size size2_01;
  rect_size size2_02;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Test Perf (with loop count ",0x1b);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,loop_count);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")\n",2);
  size2.cy = 0x11f;
  size2.cx = 0x17c;
  test_file("test/alphatest.raw",0,size2,8,4,false,loop_count);
  size2_00.cy = 0x400;
  size2_00.cx = 0x400;
  test_file("test/MR2_UNC",0x6c0,size2_00,0x10,1,true,loop_count);
  size2_01.cy = 0x400;
  size2_01.cx = 0x400;
  test_file("test/0015.raw",0,size2_01,8,1,false,loop_count);
  size2_02.cy = 0x400;
  size2_02.cx = 0x500;
  test_file("test/desktop.ppm",0x28,size2_02,8,3,false,loop_count);
  return;
}

Assistant:

void performance_tests(const int loop_count)
{
#ifdef _DEBUG
    cout << "NOTE: running performance test in debug mode, performance may be slow!\n";
#endif
    cout << "Test Perf (with loop count " << loop_count << ")\n";
    test_performance(loop_count);
}